

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# left_right.cpp
# Opt level: O3

void duckdb::RightFunction<duckdb::LeftRightGrapheme>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  VectorType VVar1;
  VectorType VVar2;
  unsigned_long *puVar3;
  anon_union_16_2_67f50693_for_value *paVar4;
  Vector *pVVar5;
  data_ptr_t pdVar6;
  idx_t count;
  size_t *psVar7;
  data_ptr_t pdVar8;
  sel_t *psVar9;
  sel_t *psVar10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var11;
  byte bVar12;
  undefined1 auVar13 [8];
  reference vector;
  reference vector_00;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  size_t sVar17;
  idx_t iVar18;
  size_t sVar19;
  TemplatedValidityData<unsigned_long> *pTVar20;
  _Head_base<0UL,_unsigned_long_*,_false> _Var21;
  ulong uVar22;
  idx_t iVar23;
  ulong uVar24;
  idx_t iVar25;
  idx_t input_length;
  ulong uVar26;
  size_t sVar27;
  data_ptr_t pdVar28;
  data_ptr_t pdVar29;
  data_ptr_t pdVar30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var31;
  int64_t in_R9;
  idx_t idx_in_entry;
  char *input_data;
  long lVar32;
  string_t sVar33;
  anon_struct_16_3_d7536bce_for_pointer aVar34;
  string_t input;
  string_t input_00;
  string_t input_01;
  string_t input_02;
  string_t input_03;
  string_t input_04;
  string_t input_05;
  string_t input_06;
  string_t input_07;
  string_t input_08;
  string_t input_09;
  UnifiedVectorFormat ldata;
  undefined1 local_e8 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_e0;
  UnifiedVectorFormat local_d0;
  ulong local_88;
  idx_t local_80;
  UnifiedVectorFormat local_78;
  
  vector = vector<duckdb::Vector,_true>::operator[](&args->data,0);
  vector_00 = vector<duckdb::Vector,_true>::operator[](&args->data,1);
  VVar1 = vector->vector_type;
  VVar2 = vector_00->vector_type;
  if ((VVar1 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar2 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    puVar3 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    paVar4 = (anon_union_16_2_67f50693_for_value *)result->data;
    if (((puVar3 == (unsigned_long *)0x0) || ((*puVar3 & 1) != 0)) &&
       ((puVar3 = (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
        puVar3 == (unsigned_long *)0x0 || ((*puVar3 & 1) != 0)))) {
      pVVar5 = *(Vector **)vector->data;
      pdVar6 = *(data_ptr_t *)(vector->data + 8);
      sVar27 = *(size_t *)vector_00->data;
      local_d0.sel = (SelectionVector *)pVVar5;
      local_d0.data = pdVar6;
      pdVar28 = (data_ptr_t)((long)&local_d0.sel + 4);
      if (0xc < (uint)pVVar5) {
        pdVar28 = pdVar6;
      }
      sVar19 = (ulong)pVVar5 & 0xffffffff;
      if ((uint)pVVar5 != 0) {
        uVar14 = 0;
        do {
          if ((char)pdVar28[uVar14] < '\0') {
            sVar19 = Utf8Proc::GraphemeCount((char *)pdVar28,sVar19);
            break;
          }
          uVar14 = uVar14 + 1;
        } while (sVar19 != uVar14);
      }
      if ((long)sVar27 < 0) {
        sVar17 = -sVar27;
        if (SBORROW8(sVar19,-sVar27) != (long)(sVar19 + sVar27) < 0) {
          sVar17 = sVar19;
        }
        sVar27 = sVar19 - sVar17;
      }
      else if ((long)sVar19 < (long)sVar27) {
        sVar27 = sVar19;
      }
      input_07.value._8_8_ = (sVar19 - sVar27) + 1;
      input_07.value._0_8_ = pdVar6;
      aVar34 = (anon_struct_16_3_d7536bce_for_pointer)
               SubstringGrapheme((duckdb *)result,pVVar5,input_07,sVar27,in_R9);
      paVar4->pointer = aVar34;
      return;
    }
  }
  else {
    count = args->count;
    if ((VVar2 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar1 == FLAT_VECTOR) {
      psVar7 = (size_t *)vector_00->data;
      puVar3 = (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      pdVar6 = vector->data;
      if ((puVar3 == (unsigned_long *)0x0) || ((*puVar3 & 1) != 0)) {
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar28 = result->data;
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vector);
        FlatVector::VerifyFlatVector(result);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                  (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                   &(vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
             (vector->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
        if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          if (count == 0) {
            return;
          }
          sVar27 = *psVar7;
          iVar25 = 0;
          do {
            lVar32 = iVar25 * 0x10;
            pVVar5 = *(Vector **)(pdVar6 + lVar32);
            pdVar8 = *(data_ptr_t *)(pdVar6 + lVar32 + 8);
            local_d0.sel = (SelectionVector *)pVVar5;
            local_d0.data = pdVar8;
            pdVar29 = pdVar8;
            if ((uint)pVVar5 < 0xd) {
              pdVar29 = (data_ptr_t)((long)&local_d0.sel + 4);
            }
            sVar19 = (ulong)pVVar5 & 0xffffffff;
            if ((uint)pVVar5 != 0) {
              uVar14 = 0;
              do {
                if ((char)pdVar29[uVar14] < '\0') {
                  sVar19 = Utf8Proc::GraphemeCount((char *)pdVar29,sVar19);
                  break;
                }
                uVar14 = uVar14 + 1;
              } while (sVar19 != uVar14);
            }
            if ((long)sVar27 < 0) {
              if (sVar27 == 0x8000000000000000) {
                sVar17 = 0;
              }
              else {
                sVar17 = -sVar27;
                if ((long)sVar19 < (long)-sVar27) {
                  sVar17 = sVar19;
                }
                sVar17 = sVar19 - sVar17;
              }
            }
            else {
              sVar17 = sVar27;
              if ((long)sVar19 < (long)sVar27) {
                sVar17 = sVar19;
              }
            }
            input_04.value._8_8_ = (sVar19 - sVar17) + 1;
            input_04.value._0_8_ = pdVar8;
            sVar33 = SubstringGrapheme((duckdb *)result,pVVar5,input_04,sVar17,in_R9);
            *(long *)(pdVar28 + lVar32) = sVar33.value._0_8_;
            *(long *)(pdVar28 + lVar32 + 8) = sVar33.value._8_8_;
            iVar25 = iVar25 + 1;
            if (iVar25 == count) {
              return;
            }
          } while( true );
        }
        if (count + 0x3f < 0x40) {
          return;
        }
        uVar24 = 0;
        uVar14 = 0;
        do {
          puVar3 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar3 == (unsigned_long *)0x0) {
            uVar22 = uVar24 + 0x40;
            if (count <= uVar24 + 0x40) {
              uVar22 = count;
            }
LAB_01b11d74:
            uVar15 = uVar24;
            if (uVar24 < uVar22) {
              sVar27 = *psVar7;
              do {
                lVar32 = uVar24 * 0x10;
                pVVar5 = *(Vector **)(pdVar6 + lVar32);
                pdVar8 = *(data_ptr_t *)(pdVar6 + lVar32 + 8);
                local_d0.sel = (SelectionVector *)pVVar5;
                local_d0.data = pdVar8;
                pdVar29 = pdVar8;
                if ((uint)pVVar5 < 0xd) {
                  pdVar29 = (data_ptr_t)((long)&local_d0.sel + 4);
                }
                sVar19 = (ulong)pVVar5 & 0xffffffff;
                if ((uint)pVVar5 != 0) {
                  uVar16 = 0;
                  do {
                    if ((char)pdVar29[uVar16] < '\0') {
                      sVar19 = Utf8Proc::GraphemeCount((char *)pdVar29,sVar19);
                      break;
                    }
                    uVar16 = uVar16 + 1;
                  } while (sVar19 != uVar16);
                }
                if ((long)sVar27 < 0) {
                  if (sVar27 == 0x8000000000000000) {
                    sVar17 = 0;
                  }
                  else {
                    sVar17 = -sVar27;
                    if ((long)sVar19 < (long)-sVar27) {
                      sVar17 = sVar19;
                    }
                    sVar17 = sVar19 - sVar17;
                  }
                }
                else {
                  sVar17 = sVar27;
                  if ((long)sVar19 < (long)sVar27) {
                    sVar17 = sVar19;
                  }
                }
                input_00.value._8_8_ = (sVar19 - sVar17) + 1;
                input_00.value._0_8_ = pdVar8;
                sVar33 = SubstringGrapheme((duckdb *)result,pVVar5,input_00,sVar17,in_R9);
                *(long *)(pdVar28 + lVar32) = sVar33.value._0_8_;
                *(long *)(pdVar28 + lVar32 + 8) = sVar33.value._8_8_;
                uVar24 = uVar24 + 1;
                uVar15 = uVar22;
              } while (uVar24 != uVar22);
            }
          }
          else {
            uVar16 = puVar3[uVar14];
            uVar22 = uVar24 + 0x40;
            if (count <= uVar24 + 0x40) {
              uVar22 = count;
            }
            uVar15 = uVar22;
            if (uVar16 != 0) {
              if (uVar16 == 0xffffffffffffffff) goto LAB_01b11d74;
              uVar26 = uVar24;
              uVar15 = uVar24;
              if (uVar24 < uVar22) {
                do {
                  if ((uVar16 >> ((ulong)(uint)((int)uVar26 - (int)uVar24) & 0x3f) & 1) != 0) {
                    lVar32 = uVar26 * 0x10;
                    pVVar5 = *(Vector **)(pdVar6 + lVar32);
                    pdVar8 = *(data_ptr_t *)(pdVar6 + lVar32 + 8);
                    sVar27 = *psVar7;
                    local_d0.sel = (SelectionVector *)pVVar5;
                    local_d0.data = pdVar8;
                    pdVar29 = pdVar8;
                    if ((uint)pVVar5 < 0xd) {
                      pdVar29 = (data_ptr_t)((long)&local_d0.sel + 4);
                    }
                    sVar19 = (ulong)pVVar5 & 0xffffffff;
                    if ((uint)pVVar5 != 0) {
                      uVar15 = 0;
                      do {
                        if ((char)pdVar29[uVar15] < '\0') {
                          sVar19 = Utf8Proc::GraphemeCount((char *)pdVar29,sVar19);
                          break;
                        }
                        uVar15 = uVar15 + 1;
                      } while (sVar19 != uVar15);
                    }
                    if ((long)sVar27 < 0) {
                      if (sVar27 == 0x8000000000000000) {
                        sVar27 = 0;
                      }
                      else {
                        sVar17 = -sVar27;
                        if (SBORROW8(sVar19,-sVar27) != (long)(sVar19 + sVar27) < 0) {
                          sVar17 = sVar19;
                        }
                        sVar27 = sVar19 - sVar17;
                      }
                    }
                    else if ((long)sVar19 < (long)sVar27) {
                      sVar27 = sVar19;
                    }
                    input.value._8_8_ = (sVar19 - sVar27) + 1;
                    input.value._0_8_ = pdVar8;
                    sVar33 = SubstringGrapheme((duckdb *)result,pVVar5,input,sVar27,in_R9);
                    *(long *)(pdVar28 + lVar32) = sVar33.value._0_8_;
                    *(long *)(pdVar28 + lVar32 + 8) = sVar33.value._8_8_;
                  }
                  uVar26 = uVar26 + 1;
                  uVar15 = uVar22;
                } while (uVar26 != uVar22);
              }
            }
          }
          uVar24 = uVar15;
          uVar14 = uVar14 + 1;
          if (uVar14 == count + 0x3f >> 6) {
            return;
          }
        } while( true );
      }
    }
    else {
      if ((VVar1 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar2 != FLAT_VECTOR) {
        if (VVar2 == FLAT_VECTOR && VVar1 == FLAT_VECTOR) {
          pdVar6 = vector->data;
          pdVar28 = vector_00->data;
          Vector::SetVectorType(result,FLAT_VECTOR);
          pdVar8 = result->data;
          FlatVector::VerifyFlatVector(result);
          FlatVector::VerifyFlatVector(vector);
          FlatVector::VerifyFlatVector(result);
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                    (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                     &(vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
          (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
               (vector->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
          FlatVector::VerifyFlatVector(vector_00);
          ValidityMask::Combine(&result->validity,&vector_00->validity,count);
          if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            if (count != 0) {
              iVar25 = 0;
              do {
                lVar32 = iVar25 * 0x10;
                pVVar5 = *(Vector **)(pdVar6 + lVar32);
                pdVar29 = *(data_ptr_t *)(pdVar6 + lVar32 + 8);
                sVar27 = *(size_t *)(pdVar28 + iVar25 * 8);
                local_d0.sel = (SelectionVector *)pVVar5;
                local_d0.data = pdVar29;
                pdVar30 = pdVar29;
                if ((uint)pVVar5 < 0xd) {
                  pdVar30 = (data_ptr_t)((long)&local_d0.sel + 4);
                }
                sVar19 = (ulong)pVVar5 & 0xffffffff;
                if ((uint)pVVar5 != 0) {
                  uVar14 = 0;
                  do {
                    if ((char)pdVar30[uVar14] < '\0') {
                      sVar19 = Utf8Proc::GraphemeCount((char *)pdVar30,sVar19);
                      break;
                    }
                    uVar14 = uVar14 + 1;
                  } while (sVar19 != uVar14);
                }
                if ((long)sVar27 < 0) {
                  if (sVar27 == 0x8000000000000000) {
                    sVar27 = 0;
                  }
                  else {
                    sVar17 = -sVar27;
                    if (SBORROW8(sVar19,-sVar27) != (long)(sVar19 + sVar27) < 0) {
                      sVar17 = sVar19;
                    }
                    sVar27 = sVar19 - sVar17;
                  }
                }
                else if ((long)sVar19 < (long)sVar27) {
                  sVar27 = sVar19;
                }
                sVar33.value._8_8_ = (sVar19 - sVar27) + 1;
                sVar33.value._0_8_ = pdVar29;
                sVar33 = SubstringGrapheme((duckdb *)result,pVVar5,sVar33,sVar27,in_R9);
                *(long *)(pdVar8 + lVar32) = sVar33.value._0_8_;
                *(long *)(pdVar8 + lVar32 + 8) = sVar33.value._8_8_;
                iVar25 = iVar25 + 1;
              } while (iVar25 != count);
            }
          }
          else if (0x3f < count + 0x3f) {
            local_88 = count + 0x3f >> 6;
            uVar24 = 0;
            uVar14 = 0;
            do {
              puVar3 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar3 == (unsigned_long *)0x0) {
                uVar22 = uVar14 + 0x40;
                if (count <= uVar14 + 0x40) {
                  uVar22 = count;
                }
LAB_01b12630:
                uVar15 = uVar14;
                if (uVar14 < uVar22) {
                  do {
                    lVar32 = uVar14 * 0x10;
                    pVVar5 = *(Vector **)(pdVar6 + lVar32);
                    pdVar29 = *(data_ptr_t *)(pdVar6 + lVar32 + 8);
                    sVar27 = *(size_t *)(pdVar28 + uVar14 * 8);
                    local_d0.sel = (SelectionVector *)pVVar5;
                    local_d0.data = pdVar29;
                    pdVar30 = pdVar29;
                    if ((uint)pVVar5 < 0xd) {
                      pdVar30 = (data_ptr_t)((long)&local_d0.sel + 4);
                    }
                    sVar19 = (ulong)pVVar5 & 0xffffffff;
                    if ((uint)pVVar5 != 0) {
                      uVar16 = 0;
                      do {
                        if ((char)pdVar30[uVar16] < '\0') {
                          sVar19 = Utf8Proc::GraphemeCount((char *)pdVar30,sVar19);
                          break;
                        }
                        uVar16 = uVar16 + 1;
                      } while (sVar19 != uVar16);
                    }
                    if ((long)sVar27 < 0) {
                      if (sVar27 == 0x8000000000000000) {
                        sVar27 = 0;
                      }
                      else {
                        sVar17 = -sVar27;
                        if (SBORROW8(sVar19,-sVar27) != (long)(sVar19 + sVar27) < 0) {
                          sVar17 = sVar19;
                        }
                        sVar27 = sVar19 - sVar17;
                      }
                    }
                    else if ((long)sVar19 < (long)sVar27) {
                      sVar27 = sVar19;
                    }
                    input_06.value._8_8_ = (sVar19 - sVar27) + 1;
                    input_06.value._0_8_ = pdVar29;
                    sVar33 = SubstringGrapheme((duckdb *)result,pVVar5,input_06,sVar27,in_R9);
                    *(long *)(pdVar8 + lVar32) = sVar33.value._0_8_;
                    *(long *)(pdVar8 + lVar32 + 8) = sVar33.value._8_8_;
                    uVar14 = uVar14 + 1;
                    uVar15 = uVar22;
                  } while (uVar14 != uVar22);
                }
              }
              else {
                uVar16 = puVar3[uVar24];
                uVar22 = uVar14 + 0x40;
                if (count <= uVar14 + 0x40) {
                  uVar22 = count;
                }
                uVar15 = uVar22;
                if (uVar16 != 0) {
                  if (uVar16 == 0xffffffffffffffff) goto LAB_01b12630;
                  uVar15 = uVar14;
                  uVar26 = uVar14;
                  if (uVar14 < uVar22) {
                    do {
                      if ((uVar16 >> ((ulong)(uint)((int)uVar26 - (int)uVar14) & 0x3f) & 1) != 0) {
                        lVar32 = uVar26 * 0x10;
                        pVVar5 = *(Vector **)(pdVar6 + lVar32);
                        pdVar29 = *(data_ptr_t *)(pdVar6 + lVar32 + 8);
                        sVar27 = *(size_t *)(pdVar28 + uVar26 * 8);
                        local_d0.sel = (SelectionVector *)pVVar5;
                        local_d0.data = pdVar29;
                        pdVar30 = pdVar29;
                        if ((uint)pVVar5 < 0xd) {
                          pdVar30 = (data_ptr_t)((long)&local_d0.sel + 4);
                        }
                        sVar19 = (ulong)pVVar5 & 0xffffffff;
                        if ((uint)pVVar5 != 0) {
                          uVar15 = 0;
                          do {
                            if ((char)pdVar30[uVar15] < '\0') {
                              sVar19 = Utf8Proc::GraphemeCount((char *)pdVar30,sVar19);
                              break;
                            }
                            uVar15 = uVar15 + 1;
                          } while (sVar19 != uVar15);
                        }
                        if ((long)sVar27 < 0) {
                          if (sVar27 == 0x8000000000000000) {
                            sVar27 = 0;
                          }
                          else {
                            sVar17 = -sVar27;
                            if (SBORROW8(sVar19,-sVar27) != (long)(sVar19 + sVar27) < 0) {
                              sVar17 = sVar19;
                            }
                            sVar27 = sVar19 - sVar17;
                          }
                        }
                        else if ((long)sVar19 < (long)sVar27) {
                          sVar27 = sVar19;
                        }
                        input_05.value._8_8_ = (sVar19 - sVar27) + 1;
                        input_05.value._0_8_ = pdVar29;
                        sVar33 = SubstringGrapheme((duckdb *)result,pVVar5,input_05,sVar27,in_R9);
                        *(long *)(pdVar8 + lVar32) = sVar33.value._0_8_;
                        *(long *)(pdVar8 + lVar32 + 8) = sVar33.value._8_8_;
                      }
                      uVar26 = uVar26 + 1;
                      uVar15 = uVar22;
                    } while (uVar26 != uVar22);
                  }
                }
              }
              uVar24 = uVar24 + 1;
              uVar14 = uVar15;
            } while (uVar24 != local_88);
          }
        }
        else {
          UnifiedVectorFormat::UnifiedVectorFormat(&local_d0);
          UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
          Vector::ToUnifiedFormat(vector,count,&local_d0);
          Vector::ToUnifiedFormat(vector_00,count,&local_78);
          Vector::SetVectorType(result,FLAT_VECTOR);
          pdVar6 = result->data;
          FlatVector::VerifyFlatVector(result);
          if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0 &&
              local_d0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            if (count != 0) {
              psVar9 = (local_d0.sel)->sel_vector;
              psVar10 = (local_78.sel)->sel_vector;
              iVar25 = 0;
              do {
                iVar18 = iVar25;
                if (psVar9 != (sel_t *)0x0) {
                  iVar18 = (idx_t)psVar9[iVar25];
                }
                iVar23 = iVar25;
                if (psVar10 != (sel_t *)0x0) {
                  iVar23 = (idx_t)psVar10[iVar25];
                }
                pVVar5 = *(Vector **)(local_d0.data + iVar18 * 0x10);
                p_Var11 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                           (local_d0.data + iVar18 * 0x10 + 8);
                sVar27 = *(size_t *)(local_78.data + iVar23 * 8);
                p_Stack_e0 = p_Var11;
                p_Var31 = p_Var11;
                if ((uint)pVVar5 < 0xd) {
                  p_Var31 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e8 + 4);
                }
                sVar19 = (ulong)pVVar5 & 0xffffffff;
                local_e8 = (undefined1  [8])pVVar5;
                if ((uint)pVVar5 != 0) {
                  uVar14 = 0;
                  do {
                    if (*(char *)((long)&p_Var31->_vptr__Sp_counted_base + uVar14) < '\0') {
                      sVar19 = Utf8Proc::GraphemeCount((char *)p_Var31,sVar19);
                      break;
                    }
                    uVar14 = uVar14 + 1;
                  } while (sVar19 != uVar14);
                }
                if ((long)sVar27 < 0) {
                  if (sVar27 == 0x8000000000000000) {
                    sVar27 = 0;
                  }
                  else {
                    sVar17 = -sVar27;
                    if (SBORROW8(sVar19,-sVar27) != (long)(sVar19 + sVar27) < 0) {
                      sVar17 = sVar19;
                    }
                    sVar27 = sVar19 - sVar17;
                  }
                }
                else if ((long)sVar19 < (long)sVar27) {
                  sVar27 = sVar19;
                }
                input_01.value._8_8_ = (sVar19 - sVar27) + 1;
                input_01.value._0_8_ = p_Var11;
                sVar33 = SubstringGrapheme((duckdb *)result,pVVar5,input_01,sVar27,in_R9);
                *(long *)(pdVar6 + iVar25 * 0x10) = sVar33.value._0_8_;
                *(long *)(pdVar6 + iVar25 * 0x10 + 8) = sVar33.value._8_8_;
                iVar25 = iVar25 + 1;
              } while (iVar25 != count);
            }
          }
          else if (count != 0) {
            psVar9 = (local_d0.sel)->sel_vector;
            psVar10 = (local_78.sel)->sel_vector;
            uVar14 = 0;
            do {
              uVar24 = uVar14;
              if (psVar9 != (sel_t *)0x0) {
                uVar24 = (ulong)psVar9[uVar14];
              }
              uVar22 = uVar14;
              if (psVar10 != (sel_t *)0x0) {
                uVar22 = (ulong)psVar10[uVar14];
              }
              if (((local_d0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                    (unsigned_long *)0x0) ||
                  ((local_d0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [uVar24 >> 6] >> (uVar24 & 0x3f) & 1) != 0)) &&
                 ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                   (unsigned_long *)0x0 ||
                  ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [uVar22 >> 6] >> (uVar22 & 0x3f) & 1) != 0)))) {
                pVVar5 = *(Vector **)(local_d0.data + uVar24 * 0x10);
                p_Var11 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                           (local_d0.data + uVar24 * 0x10 + 8);
                sVar27 = *(size_t *)(local_78.data + uVar22 * 8);
                p_Stack_e0 = p_Var11;
                p_Var31 = p_Var11;
                if ((uint)pVVar5 < 0xd) {
                  p_Var31 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e8 + 4);
                }
                sVar19 = (ulong)pVVar5 & 0xffffffff;
                local_e8 = (undefined1  [8])pVVar5;
                if ((uint)pVVar5 != 0) {
                  uVar24 = 0;
                  do {
                    if (*(char *)((long)&p_Var31->_vptr__Sp_counted_base + uVar24) < '\0') {
                      sVar19 = Utf8Proc::GraphemeCount((char *)p_Var31,sVar19);
                      break;
                    }
                    uVar24 = uVar24 + 1;
                  } while (sVar19 != uVar24);
                }
                if ((long)sVar27 < 0) {
                  if (sVar27 == 0x8000000000000000) {
                    sVar27 = 0;
                  }
                  else {
                    sVar17 = -sVar27;
                    if (SBORROW8(sVar19,-sVar27) != (long)(sVar19 + sVar27) < 0) {
                      sVar17 = sVar19;
                    }
                    sVar27 = sVar19 - sVar17;
                  }
                }
                else if ((long)sVar19 < (long)sVar27) {
                  sVar27 = sVar19;
                }
                input_08.value._8_8_ = (sVar19 - sVar27) + 1;
                input_08.value._0_8_ = p_Var11;
                sVar33 = SubstringGrapheme((duckdb *)result,pVVar5,input_08,sVar27,in_R9);
                *(long *)(pdVar6 + uVar14 * 0x10) = sVar33.value._0_8_;
                *(long *)(pdVar6 + uVar14 * 0x10 + 8) = sVar33.value._8_8_;
              }
              else {
                _Var21._M_head_impl =
                     (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (_Var21._M_head_impl == (unsigned_long *)0x0) {
                  local_80 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
                  make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                            ((duckdb *)local_e8,&local_80);
                  p_Var31 = p_Stack_e0;
                  auVar13 = local_e8;
                  local_e8 = (undefined1  [8])0x0;
                  p_Stack_e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  p_Var11 = (result->validity).super_TemplatedValidityMask<unsigned_long>.
                            validity_data.internal.
                            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi;
                  (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = (element_type *)auVar13;
                  (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi = p_Var31;
                  if ((p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                     (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var11),
                     p_Stack_e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_e0);
                  }
                  pTVar20 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                            operator->(&(result->validity).
                                        super_TemplatedValidityMask<unsigned_long>.validity_data);
                  _Var21._M_head_impl =
                       (pTVar20->owned_data).
                       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t
                       .super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                  (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                       _Var21._M_head_impl;
                }
                bVar12 = (byte)uVar14 & 0x3f;
                _Var21._M_head_impl[uVar14 >> 6] =
                     _Var21._M_head_impl[uVar14 >> 6] &
                     (-2L << bVar12 | 0xfffffffffffffffeU >> 0x40 - bVar12);
              }
              uVar14 = uVar14 + 1;
            } while (uVar14 != count);
          }
          if (local_78.owned_sel.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_78.owned_sel.selection_data.internal.
                       super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          if (local_d0.owned_sel.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_d0.owned_sel.selection_data.internal.
                       super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_d0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_d0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
        }
        return;
      }
      pdVar6 = vector->data;
      puVar3 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      pdVar28 = vector_00->data;
      if ((puVar3 == (unsigned_long *)0x0) || ((*puVar3 & 1) != 0)) {
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar8 = result->data;
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vector_00);
        FlatVector::VerifyFlatVector(result);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                  (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                   &(vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
             (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
        if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          if (count == 0) {
            return;
          }
          pVVar5 = *(Vector **)pdVar6;
          pdVar6 = *(data_ptr_t *)(pdVar6 + 8);
          pdVar29 = (data_ptr_t)((long)&local_d0.sel + 4);
          if (0xc < (uint)pVVar5) {
            pdVar29 = pdVar6;
          }
          uVar14 = (ulong)pVVar5 & 0xffffffff;
          iVar25 = 0;
          do {
            sVar27 = *(size_t *)(pdVar28 + iVar25 * 8);
            local_d0.sel = (SelectionVector *)pVVar5;
            local_d0.data = pdVar6;
            uVar24 = uVar14;
            if ((uint)pVVar5 != 0) {
              uVar22 = 0;
              do {
                if ((char)pdVar29[uVar22] < '\0') {
                  uVar24 = Utf8Proc::GraphemeCount((char *)pdVar29,uVar14);
                  break;
                }
                uVar22 = uVar22 + 1;
              } while (uVar14 != uVar22);
            }
            if ((long)sVar27 < 0) {
              if (sVar27 == 0x8000000000000000) {
                sVar27 = 0;
              }
              else {
                sVar19 = -sVar27;
                if (SBORROW8(uVar24,-sVar27) != (long)(uVar24 + sVar27) < 0) {
                  sVar19 = uVar24;
                }
                sVar27 = uVar24 - sVar19;
              }
            }
            else if ((long)uVar24 < (long)sVar27) {
              sVar27 = uVar24;
            }
            input_09.value._8_8_ = (uVar24 - sVar27) + 1;
            input_09.value._0_8_ = pdVar6;
            sVar33 = SubstringGrapheme((duckdb *)result,pVVar5,input_09,sVar27,in_R9);
            *(long *)(pdVar8 + iVar25 * 0x10) = sVar33.value._0_8_;
            *(long *)(pdVar8 + iVar25 * 0x10 + 8) = sVar33.value._8_8_;
            iVar25 = iVar25 + 1;
            if (iVar25 == count) {
              return;
            }
          } while( true );
        }
        if (count + 0x3f < 0x40) {
          return;
        }
        uVar24 = 0;
        uVar14 = 0;
        do {
          puVar3 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar3 == (unsigned_long *)0x0) {
            uVar22 = uVar24 + 0x40;
            if (count <= uVar24 + 0x40) {
              uVar22 = count;
            }
LAB_01b12215:
            uVar15 = uVar24;
            if (uVar24 < uVar22) {
              pVVar5 = *(Vector **)pdVar6;
              pdVar29 = *(data_ptr_t *)(pdVar6 + 8);
              pdVar30 = pdVar29;
              if ((uint)pVVar5 < 0xd) {
                pdVar30 = (data_ptr_t)((long)&local_d0.sel + 4);
              }
              uVar16 = (ulong)pVVar5 & 0xffffffff;
              do {
                sVar27 = *(size_t *)(pdVar28 + uVar24 * 8);
                local_d0.sel = (SelectionVector *)pVVar5;
                local_d0.data = pdVar29;
                uVar15 = uVar16;
                if ((uint)pVVar5 != 0) {
                  uVar26 = 0;
                  do {
                    if ((char)pdVar30[uVar26] < '\0') {
                      uVar15 = Utf8Proc::GraphemeCount((char *)pdVar30,uVar16);
                      break;
                    }
                    uVar26 = uVar26 + 1;
                  } while (uVar16 != uVar26);
                }
                if ((long)sVar27 < 0) {
                  if (sVar27 == 0x8000000000000000) {
                    sVar27 = 0;
                  }
                  else {
                    sVar19 = -sVar27;
                    if (SBORROW8(uVar15,-sVar27) != (long)(uVar15 + sVar27) < 0) {
                      sVar19 = uVar15;
                    }
                    sVar27 = uVar15 - sVar19;
                  }
                }
                else if ((long)uVar15 < (long)sVar27) {
                  sVar27 = uVar15;
                }
                input_03.value._8_8_ = (uVar15 - sVar27) + 1;
                input_03.value._0_8_ = pdVar29;
                sVar33 = SubstringGrapheme((duckdb *)result,pVVar5,input_03,sVar27,in_R9);
                *(long *)(pdVar8 + uVar24 * 0x10) = sVar33.value._0_8_;
                *(long *)(pdVar8 + uVar24 * 0x10 + 8) = sVar33.value._8_8_;
                uVar24 = uVar24 + 1;
                uVar15 = uVar22;
              } while (uVar24 != uVar22);
            }
          }
          else {
            uVar16 = puVar3[uVar14];
            uVar22 = uVar24 + 0x40;
            if (count <= uVar24 + 0x40) {
              uVar22 = count;
            }
            uVar15 = uVar22;
            if (uVar16 != 0) {
              if (uVar16 == 0xffffffffffffffff) goto LAB_01b12215;
              uVar26 = uVar24;
              uVar15 = uVar24;
              if (uVar24 < uVar22) {
                do {
                  if ((uVar16 >> ((ulong)(uint)((int)uVar26 - (int)uVar24) & 0x3f) & 1) != 0) {
                    pVVar5 = *(Vector **)pdVar6;
                    pdVar29 = *(data_ptr_t *)(pdVar6 + 8);
                    sVar27 = *(size_t *)(pdVar28 + uVar26 * 8);
                    local_d0.sel = (SelectionVector *)pVVar5;
                    local_d0.data = pdVar29;
                    pdVar30 = pdVar29;
                    if ((uint)pVVar5 < 0xd) {
                      pdVar30 = (data_ptr_t)((long)&local_d0.sel + 4);
                    }
                    sVar19 = (ulong)pVVar5 & 0xffffffff;
                    if ((uint)pVVar5 != 0) {
                      uVar15 = 0;
                      do {
                        if ((char)pdVar30[uVar15] < '\0') {
                          sVar19 = Utf8Proc::GraphemeCount((char *)pdVar30,sVar19);
                          break;
                        }
                        uVar15 = uVar15 + 1;
                      } while (sVar19 != uVar15);
                    }
                    if ((long)sVar27 < 0) {
                      if (sVar27 == 0x8000000000000000) {
                        sVar27 = 0;
                      }
                      else {
                        sVar17 = -sVar27;
                        if (SBORROW8(sVar19,-sVar27) != (long)(sVar19 + sVar27) < 0) {
                          sVar17 = sVar19;
                        }
                        sVar27 = sVar19 - sVar17;
                      }
                    }
                    else if ((long)sVar19 < (long)sVar27) {
                      sVar27 = sVar19;
                    }
                    input_02.value._8_8_ = (sVar19 - sVar27) + 1;
                    input_02.value._0_8_ = pdVar29;
                    sVar33 = SubstringGrapheme((duckdb *)result,pVVar5,input_02,sVar27,in_R9);
                    *(long *)(pdVar8 + uVar26 * 0x10) = sVar33.value._0_8_;
                    *(long *)(pdVar8 + uVar26 * 0x10 + 8) = sVar33.value._8_8_;
                  }
                  uVar26 = uVar26 + 1;
                  uVar15 = uVar22;
                } while (uVar26 != uVar22);
              }
            }
          }
          uVar24 = uVar15;
          uVar14 = uVar14 + 1;
          if (uVar14 == count + 0x3f >> 6) {
            return;
          }
        } while( true );
      }
    }
    Vector::SetVectorType(result,CONSTANT_VECTOR);
  }
  ConstantVector::SetNull(result,true);
  return;
}

Assistant:

static void RightFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	auto &str_vec = args.data[0];
	auto &pos_vec = args.data[1];
	BinaryExecutor::Execute<string_t, int64_t, string_t>(
	    str_vec, pos_vec, result, args.size(),
	    [&](string_t str, int64_t pos) { return RightScalarFunction<OP>(result, str, pos); });
}